

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simdjson.h
# Opt level: O1

uint32_t simdjson::fallback::anon_unknown_1::jsoncharutils::hex_to_u32_nocheck(uint8_t *src)

{
  return *(uint *)(&DAT_00190cd0 + (ulong)src[1] * 4) | *(uint *)(&DAT_00191018 + (ulong)*src * 4) |
         *(uint *)(&DAT_00190988 + (ulong)src[2] * 4) |
         *(uint *)(&internal::digit_to_val32 + (ulong)src[3] * 4);
}

Assistant:

static inline uint32_t hex_to_u32_nocheck(
    const uint8_t *src) { // strictly speaking, static inline is a C-ism
  uint32_t v1 = internal::digit_to_val32[630 + src[0]];
  uint32_t v2 = internal::digit_to_val32[420 + src[1]];
  uint32_t v3 = internal::digit_to_val32[210 + src[2]];
  uint32_t v4 = internal::digit_to_val32[0 + src[3]];
  return v1 | v2 | v3 | v4;
}